

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::ClipperOffset::FixOrientations(ClipperOffset *this)

{
  PolyNode *pPVar1;
  bool bVar2;
  int i_1;
  Path *poly;
  int i;
  long lVar3;
  pointer ppPVar4;
  
  lVar3 = (this->m_lowest).X;
  if (-1 < lVar3) {
    ppPVar4 = (this->m_polyNodes).Childs.
              super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    bVar2 = Orientation(&ppPVar4[(int)lVar3]->Contour);
    if (!bVar2) {
      for (lVar3 = 0;
          lVar3 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                      super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar4) >>
                       3); lVar3 = lVar3 + 1) {
        pPVar1 = ppPVar4[lVar3];
        if ((pPVar1->m_endtype == etClosedPolygon) ||
           ((pPVar1->m_endtype == etClosedLine && (bVar2 = Orientation(&pPVar1->Contour), bVar2))))
        {
          ReversePath(&pPVar1->Contour);
          ppPVar4 = (this->m_polyNodes).Childs.
                    super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      return;
    }
  }
  for (lVar3 = 0;
      ppPVar4 = (this->m_polyNodes).Childs.
                super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      lVar3 < (int)((ulong)((long)(this->m_polyNodes).Childs.
                                  super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar4) >> 3);
      lVar3 = lVar3 + 1) {
    pPVar1 = ppPVar4[lVar3];
    if (pPVar1->m_endtype == etClosedLine) {
      poly = &pPVar1->Contour;
      bVar2 = Orientation(poly);
      if (!bVar2) {
        ReversePath(poly);
      }
    }
  }
  return;
}

Assistant:

void ClipperOffset::FixOrientations()
{
  //fixup orientations of all closed paths if the orientation of the
  //closed path with the lowermost vertex is wrong ...
  if (m_lowest.X >= 0 && 
    !Orientation(m_polyNodes.Childs[(int)m_lowest.X]->Contour))
  {
    for (int i = 0; i < m_polyNodes.ChildCount(); ++i)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedPolygon ||
        (node.m_endtype == etClosedLine && Orientation(node.Contour)))
          ReversePath(node.Contour);
    }
  } else
  {
    for (int i = 0; i < m_polyNodes.ChildCount(); ++i)
    {
      PolyNode& node = *m_polyNodes.Childs[i];
      if (node.m_endtype == etClosedLine && !Orientation(node.Contour))
        ReversePath(node.Contour);
    }
  }
}